

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_progressbar.cpp
# Opt level: O0

void QtMWidgets::ProgressBar::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  Orientation *pOVar2;
  bool bVar3;
  Orientation OVar4;
  QColor *pQVar5;
  void *_v_1;
  ProgressBar *_t_2;
  void *_v;
  ProgressBar *_t_1;
  int *result;
  ProgressBar *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      valueChanged((ProgressBar *)_o,*_a[1]);
      break;
    case 1:
      reset((ProgressBar *)_o);
      break;
    case 2:
      setRange((ProgressBar *)_o,*_a[1],*_a[2]);
      break;
    case 3:
      setMinimum((ProgressBar *)_o,*_a[1]);
      break;
    case 4:
      setMaximum((ProgressBar *)_o,*_a[1]);
      break;
    case 5:
      setValue((ProgressBar *)_o,*_a[1]);
      break;
    case 6:
      setOrientation((ProgressBar *)_o,*_a[1]);
      break;
    case 7:
      _q_animation((ProgressBar *)_o,(QVariant *)_a[1]);
    }
  }
  else if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    if (pcVar1 == valueChanged && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  else if (_c == ReadProperty) {
    pOVar2 = (Orientation *)*_a;
    switch(_id) {
    case 0:
      OVar4 = minimum((ProgressBar *)_o);
      *pOVar2 = OVar4;
      break;
    case 1:
      OVar4 = maximum((ProgressBar *)_o);
      *pOVar2 = OVar4;
      break;
    case 2:
      OVar4 = value((ProgressBar *)_o);
      *pOVar2 = OVar4;
      break;
    case 3:
      OVar4 = orientation((ProgressBar *)_o);
      *pOVar2 = OVar4;
      break;
    case 4:
      bVar3 = invertedAppearance((ProgressBar *)_o);
      *(bool *)pOVar2 = bVar3;
      break;
    case 5:
      OVar4 = grooveHeight((ProgressBar *)_o);
      *pOVar2 = OVar4;
      break;
    case 6:
      pQVar5 = highlightColor((ProgressBar *)_o);
      *(undefined8 *)pOVar2 = *(undefined8 *)pQVar5;
      pOVar2[2] = *(Orientation *)((long)&pQVar5->ct + 4);
      *(ushort *)(pOVar2 + 3) = (pQVar5->ct).argb.pad;
      break;
    case 7:
      pQVar5 = grooveColor((ProgressBar *)_o);
      *(undefined8 *)pOVar2 = *(undefined8 *)pQVar5;
      pOVar2[2] = *(Orientation *)((long)&pQVar5->ct + 4);
      *(ushort *)(pOVar2 + 3) = (pQVar5->ct).argb.pad;
    }
  }
  else if (_c == WriteProperty) {
    pQVar5 = (QColor *)*_a;
    switch(_id) {
    case 0:
      setMinimum((ProgressBar *)_o,pQVar5->cspec);
      break;
    case 1:
      setMaximum((ProgressBar *)_o,pQVar5->cspec);
      break;
    case 2:
      setValue((ProgressBar *)_o,pQVar5->cspec);
      break;
    case 3:
      setOrientation((ProgressBar *)_o,pQVar5->cspec);
      break;
    case 4:
      setInvertedAppearance((ProgressBar *)_o,(bool)((char)pQVar5->cspec & Rgb));
      break;
    case 5:
      setGrooveHeight((ProgressBar *)_o,pQVar5->cspec);
      break;
    case 6:
      setHighlightColor((ProgressBar *)_o,pQVar5);
      break;
    case 7:
      setGrooveColor((ProgressBar *)_o,pQVar5);
    }
  }
  return;
}

Assistant:

void QtMWidgets::ProgressBar::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<ProgressBar *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->reset(); break;
        case 2: _t->setRange((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->setMinimum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->setMaximum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setValue((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->setOrientation((*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[1]))); break;
        case 7: _t->_q_animation((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (ProgressBar::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ProgressBar::valueChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<ProgressBar *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->minimum(); break;
        case 1: *reinterpret_cast< int*>(_v) = _t->maximum(); break;
        case 2: *reinterpret_cast< int*>(_v) = _t->value(); break;
        case 3: *reinterpret_cast< Qt::Orientation*>(_v) = _t->orientation(); break;
        case 4: *reinterpret_cast< bool*>(_v) = _t->invertedAppearance(); break;
        case 5: *reinterpret_cast< int*>(_v) = _t->grooveHeight(); break;
        case 6: *reinterpret_cast< QColor*>(_v) = _t->highlightColor(); break;
        case 7: *reinterpret_cast< QColor*>(_v) = _t->grooveColor(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<ProgressBar *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMinimum(*reinterpret_cast< int*>(_v)); break;
        case 1: _t->setMaximum(*reinterpret_cast< int*>(_v)); break;
        case 2: _t->setValue(*reinterpret_cast< int*>(_v)); break;
        case 3: _t->setOrientation(*reinterpret_cast< Qt::Orientation*>(_v)); break;
        case 4: _t->setInvertedAppearance(*reinterpret_cast< bool*>(_v)); break;
        case 5: _t->setGrooveHeight(*reinterpret_cast< int*>(_v)); break;
        case 6: _t->setHighlightColor(*reinterpret_cast< QColor*>(_v)); break;
        case 7: _t->setGrooveColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}